

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O1

uint16_t eia608_midrow_change(int chan,eia608_style_t style,int underline)

{
  uint uVar1;
  
  uVar1 = (chan & 1U) * 0x800 + (style & eia608_style_italics) * 2 + (underline & 1U) + 0x1120;
  return CONCAT11(eia608_parity_table[uVar1 >> 8],eia608_parity_table[uVar1 & 0xff]);
}

Assistant:

uint16_t eia608_midrow_change(int chan, eia608_style_t style, int underline) { return eia608_parity(0x1120 | ((chan << 11) & 0x0800) | ((style << 1) & 0x000E) | (underline & 0x0001)); }